

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<void_(int,_int)>::PerformDefaultAction
          (FunctionMocker<void_(int,_int)> *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<void_(int,_int)> *this_00;
  Action<void_(int,_int)> *this_01;
  string message;
  _Tuple_impl<0UL,_int,_int> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<void_(int,_int)> *)0x0) {
    std::operator+(&local_30,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    this_01 = OnCallSpec<void_(int,_int)>::GetAction(this_00);
    local_38 = args->super__Tuple_impl<0UL,_int,_int>;
    Action<void_(int,_int)>::Perform(this_01,(ArgumentTuple *)&local_38);
  }
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec = this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }